

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_smooth_predictor_8x32_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  ulong uVar1;
  short sVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  unkuint9 Var11;
  undefined1 auVar12 [11];
  undefined1 auVar13 [13];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  uint8_t *puVar19;
  uint8_t *puVar20;
  ushort uVar21;
  undefined1 uVar24;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined2 uVar28;
  undefined2 uVar29;
  undefined1 auVar27 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined1 auVar39 [16];
  uint uVar40;
  uint uVar46;
  uint uVar47;
  __m128i d_2;
  undefined1 auVar41 [16];
  uint uVar48;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  __m128i d;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  __m128i rep;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar71 [16];
  undefined1 auVar75 [16];
  undefined1 auVar79 [16];
  undefined1 auVar26 [16];
  undefined1 auVar32 [16];
  undefined1 auVar36 [16];
  undefined1 auVar33 [16];
  undefined1 auVar37 [16];
  undefined1 auVar34 [16];
  undefined1 auVar38 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar68 [16];
  undefined1 auVar72 [16];
  undefined1 auVar76 [16];
  undefined1 auVar80 [16];
  undefined1 auVar69 [16];
  undefined1 auVar73 [16];
  undefined1 auVar77 [16];
  undefined1 auVar81 [16];
  undefined1 auVar70 [16];
  undefined1 auVar74 [16];
  undefined1 auVar78 [16];
  undefined1 auVar82 [16];
  
  auVar44 = _DAT_005106e0;
  auVar17 = _DAT_005106c0;
  auVar16 = _DAT_005106b0;
  auVar22 = pshuflw(ZEXT116(left[0x1f]),ZEXT116(left[0x1f]),0);
  uVar1 = *(ulong *)above;
  uVar24 = (undefined1)(uVar1 >> 0x38);
  auVar3._8_6_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xe] = uVar24;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4[0xc] = (char)(uVar1 >> 0x30);
  auVar4._13_2_ = auVar3._13_2_;
  auVar5._8_4_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5._12_3_ = auVar4._12_3_;
  auVar6._8_2_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6[10] = (char)(uVar1 >> 0x28);
  auVar6._11_4_ = auVar5._11_4_;
  auVar7._8_2_ = 0;
  auVar7._0_8_ = uVar1;
  auVar7._10_5_ = auVar6._10_5_;
  auVar8[8] = (char)(uVar1 >> 0x20);
  auVar8._0_8_ = uVar1;
  auVar8._9_6_ = auVar7._9_6_;
  auVar10._7_8_ = 0;
  auVar10._0_7_ = auVar8._8_7_;
  Var11 = CONCAT81(SUB158(auVar10 << 0x40,7),(char)(uVar1 >> 0x18));
  auVar14._9_6_ = 0;
  auVar14._0_9_ = Var11;
  auVar12._1_10_ = SUB1510(auVar14 << 0x30,5);
  auVar12[0] = (char)(uVar1 >> 0x10);
  auVar15._11_4_ = 0;
  auVar15._0_11_ = auVar12;
  auVar13._1_12_ = SUB1512(auVar15 << 0x20,3);
  auVar13[0] = (char)(uVar1 >> 8);
  uVar21 = CONCAT11(0,(byte)uVar1);
  auVar9._2_13_ = auVar13;
  auVar9._0_2_ = uVar21;
  uVar29 = auVar22._2_2_;
  auVar26._0_12_ = auVar9._0_12_;
  auVar26._12_2_ = (short)Var11;
  auVar26._14_2_ = uVar29;
  auVar30._12_4_ = auVar26._12_4_;
  auVar30._0_10_ = auVar9._0_10_;
  uVar28 = auVar22._0_2_;
  auVar30._10_2_ = uVar28;
  auVar25._10_6_ = auVar30._10_6_;
  auVar25._8_2_ = auVar12._0_2_;
  auVar25._6_2_ = uVar29;
  auVar25._4_2_ = auVar13._0_2_;
  auVar25._2_2_ = uVar28;
  auVar25._0_2_ = uVar21;
  auVar23._2_2_ = uVar28;
  auVar23._0_2_ = auVar8._8_2_;
  auVar23._4_2_ = auVar6._10_2_;
  auVar23._6_2_ = uVar29;
  auVar23._8_2_ = auVar4._12_2_;
  auVar23._10_2_ = uVar28;
  auVar23[0xc] = uVar24;
  auVar23[0xd] = 0;
  auVar23._14_2_ = uVar29;
  auVar27 = pshuflw(ZEXT116(above[7]),ZEXT116(above[7]),0);
  auVar22 = *(undefined1 (*) [16])left;
  auVar26 = *(undefined1 (*) [16])(left + 0x10);
  iVar18 = 8;
  auVar39 = ZEXT816(0xe0c0a0806040200);
  puVar19 = dst;
  auVar30 = _DAT_005105b0;
  auVar61 = _DAT_004d59a0;
  do {
    auVar66 = pshufb(auVar44,auVar30);
    auVar59 = pshufb(_DAT_005106f0,auVar30);
    auVar70._0_12_ = auVar66._0_12_;
    auVar70._12_2_ = auVar66._6_2_;
    auVar70._14_2_ = auVar59._6_2_;
    auVar69._12_4_ = auVar70._12_4_;
    auVar69._0_10_ = auVar66._0_10_;
    auVar69._10_2_ = auVar59._4_2_;
    auVar68._10_6_ = auVar69._10_6_;
    auVar68._0_8_ = auVar66._0_8_;
    auVar68._8_2_ = auVar66._4_2_;
    auVar67._8_8_ = auVar68._8_8_;
    auVar67._6_2_ = auVar59._2_2_;
    auVar67._4_2_ = auVar66._2_2_;
    auVar67._0_2_ = auVar66._0_2_;
    auVar67._2_2_ = auVar59._0_2_;
    auVar60 = pmaddwd(auVar25,auVar67);
    auVar59 = pshufb(auVar22,auVar61);
    uVar29 = auVar27._2_2_;
    auVar43._0_12_ = auVar59._0_12_;
    auVar43._12_2_ = auVar59._6_2_;
    auVar43._14_2_ = uVar29;
    uVar28 = auVar27._0_2_;
    auVar66._12_4_ = auVar43._12_4_;
    auVar66._0_10_ = auVar59._0_10_;
    auVar66._10_2_ = uVar28;
    auVar42._10_6_ = auVar66._10_6_;
    auVar42._0_8_ = auVar59._0_8_;
    auVar42._8_2_ = auVar59._4_2_;
    auVar41._8_8_ = auVar42._8_8_;
    auVar41._6_2_ = uVar29;
    auVar41._4_2_ = auVar59._2_2_;
    auVar41._0_2_ = auVar59._0_2_;
    auVar41._2_2_ = uVar28;
    auVar59 = pmaddwd(auVar41,auVar16);
    uVar62 = auVar59._0_4_ + 0x100 + auVar60._0_4_;
    uVar63 = auVar59._4_4_ + 0x100 + auVar60._4_4_;
    uVar64 = auVar59._8_4_ + 0x100 + auVar60._8_4_;
    uVar65 = auVar59._12_4_ + 0x100 + auVar60._12_4_;
    auVar66 = pmaddwd(auVar67,auVar23);
    auVar59 = pmaddwd(auVar41,auVar17);
    uVar40 = auVar59._0_4_ + 0x100 + auVar66._0_4_;
    uVar46 = auVar59._4_4_ + 0x100 + auVar66._4_4_;
    uVar47 = auVar59._8_4_ + 0x100 + auVar66._8_4_;
    uVar48 = auVar59._12_4_ + 0x100 + auVar66._12_4_;
    sVar2 = (short)(uVar62 >> 9);
    uVar21 = (ushort)(uVar62 >> 0x19);
    auVar60[1] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar62 >> 0x19) - (0xff < uVar21);
    auVar60[0] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar62 >> 9) - (0xff < sVar2);
    sVar2 = (short)(uVar63 >> 9);
    auVar60[2] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar63 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar63 >> 0x19);
    auVar60[3] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar63 >> 0x19) - (0xff < uVar21);
    sVar2 = (short)(uVar64 >> 9);
    auVar60[4] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar64 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar64 >> 0x19);
    auVar60[5] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar64 >> 0x19) - (0xff < uVar21);
    sVar2 = (short)(uVar65 >> 9);
    auVar60[6] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar65 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar65 >> 0x19);
    auVar60[7] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar65 >> 0x19) - (0xff < uVar21);
    sVar2 = (short)(uVar40 >> 9);
    auVar60[8] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar40 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar40 >> 0x19);
    auVar60[9] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar40 >> 0x19) - (0xff < uVar21);
    sVar2 = (short)(uVar46 >> 9);
    auVar60[10] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar46 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar46 >> 0x19);
    auVar60[0xb] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar46 >> 0x19) - (0xff < uVar21);
    sVar2 = (short)(uVar47 >> 9);
    auVar60[0xc] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar47 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar47 >> 0x19);
    auVar60[0xd] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar47 >> 0x19) - (0xff < uVar21);
    sVar2 = (short)(uVar48 >> 9);
    auVar60[0xe] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar48 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar48 >> 0x19);
    auVar60[0xf] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar48 >> 0x19) - (0xff < uVar21);
    auVar59 = pshufb(auVar60,auVar39);
    *(long *)puVar19 = auVar59._0_8_;
    puVar19 = puVar19 + stride;
    auVar59._0_2_ = auVar61._0_2_ + 1;
    auVar59._2_2_ = auVar61._2_2_ + 1;
    auVar59._4_2_ = auVar61._4_2_ + 1;
    auVar59._6_2_ = auVar61._6_2_ + 1;
    auVar59._8_2_ = auVar61._8_2_ + 1;
    auVar59._10_2_ = auVar61._10_2_ + 1;
    auVar59._12_2_ = auVar61._12_2_ + 1;
    auVar59._14_2_ = auVar61._14_2_ + 1;
    auVar61._0_2_ = auVar30._0_2_ + 0x202;
    auVar61._2_2_ = auVar30._2_2_ + 0x202;
    auVar61._4_2_ = auVar30._4_2_ + 0x202;
    auVar61._6_2_ = auVar30._6_2_ + 0x202;
    auVar61._8_2_ = auVar30._8_2_ + 0x202;
    auVar61._10_2_ = auVar30._10_2_ + 0x202;
    auVar61._12_2_ = auVar30._12_2_ + 0x202;
    auVar61._14_2_ = auVar30._14_2_ + 0x202;
    iVar18 = iVar18 + -1;
    auVar30 = auVar61;
    auVar61 = auVar59;
  } while (iVar18 != 0);
  puVar19 = dst + stride * 8;
  iVar18 = 8;
  puVar20 = puVar19;
  auVar44 = _DAT_005105b0;
  auVar30 = _DAT_00510660;
  do {
    auVar27 = pshufb(_DAT_00510700,auVar44);
    auVar61 = pshufb(_DAT_00510710,auVar44);
    auVar74._0_12_ = auVar27._0_12_;
    auVar74._12_2_ = auVar27._6_2_;
    auVar74._14_2_ = auVar61._6_2_;
    auVar73._12_4_ = auVar74._12_4_;
    auVar73._0_10_ = auVar27._0_10_;
    auVar73._10_2_ = auVar61._4_2_;
    auVar72._10_6_ = auVar73._10_6_;
    auVar72._0_8_ = auVar27._0_8_;
    auVar72._8_2_ = auVar27._4_2_;
    auVar71._8_8_ = auVar72._8_8_;
    auVar71._6_2_ = auVar61._2_2_;
    auVar71._4_2_ = auVar27._2_2_;
    auVar71._0_2_ = auVar27._0_2_;
    auVar71._2_2_ = auVar61._0_2_;
    auVar27 = pmaddwd(auVar25,auVar71);
    auVar61 = pshufb(auVar22,auVar30);
    auVar58._0_12_ = auVar61._0_12_;
    auVar58._12_2_ = auVar61._6_2_;
    auVar58._14_2_ = uVar29;
    auVar57._12_4_ = auVar58._12_4_;
    auVar57._0_10_ = auVar61._0_10_;
    auVar57._10_2_ = uVar28;
    auVar56._10_6_ = auVar57._10_6_;
    auVar56._0_8_ = auVar61._0_8_;
    auVar56._8_2_ = auVar61._4_2_;
    auVar55._8_8_ = auVar56._8_8_;
    auVar55._6_2_ = uVar29;
    auVar55._4_2_ = auVar61._2_2_;
    auVar55._0_2_ = auVar61._0_2_;
    auVar55._2_2_ = uVar28;
    auVar61 = pmaddwd(auVar55,auVar16);
    uVar40 = auVar61._0_4_ + 0x100 + auVar27._0_4_;
    uVar46 = auVar61._4_4_ + 0x100 + auVar27._4_4_;
    uVar47 = auVar61._8_4_ + 0x100 + auVar27._8_4_;
    uVar48 = auVar61._12_4_ + 0x100 + auVar27._12_4_;
    auVar27 = pmaddwd(auVar71,auVar23);
    auVar61 = pmaddwd(auVar55,auVar17);
    uVar62 = auVar61._0_4_ + 0x100 + auVar27._0_4_;
    uVar63 = auVar61._4_4_ + 0x100 + auVar27._4_4_;
    uVar64 = auVar61._8_4_ + 0x100 + auVar27._8_4_;
    uVar65 = auVar61._12_4_ + 0x100 + auVar27._12_4_;
    sVar2 = (short)(uVar40 >> 9);
    uVar21 = (ushort)(uVar40 >> 0x19);
    auVar27[1] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar40 >> 0x19) - (0xff < uVar21);
    auVar27[0] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar40 >> 9) - (0xff < sVar2);
    sVar2 = (short)(uVar46 >> 9);
    auVar27[2] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar46 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar46 >> 0x19);
    auVar27[3] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar46 >> 0x19) - (0xff < uVar21);
    sVar2 = (short)(uVar47 >> 9);
    auVar27[4] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar47 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar47 >> 0x19);
    auVar27[5] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar47 >> 0x19) - (0xff < uVar21);
    sVar2 = (short)(uVar48 >> 9);
    auVar27[6] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar48 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar48 >> 0x19);
    auVar27[7] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar48 >> 0x19) - (0xff < uVar21);
    sVar2 = (short)(uVar62 >> 9);
    auVar27[8] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar62 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar62 >> 0x19);
    auVar27[9] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar62 >> 0x19) - (0xff < uVar21);
    sVar2 = (short)(uVar63 >> 9);
    auVar27[10] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar63 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar63 >> 0x19);
    auVar27[0xb] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar63 >> 0x19) - (0xff < uVar21);
    sVar2 = (short)(uVar64 >> 9);
    auVar27[0xc] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar64 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar64 >> 0x19);
    auVar27[0xd] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar64 >> 0x19) - (0xff < uVar21);
    sVar2 = (short)(uVar65 >> 9);
    auVar27[0xe] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar65 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar65 >> 0x19);
    auVar27[0xf] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar65 >> 0x19) - (0xff < uVar21);
    auVar61 = pshufb(auVar27,auVar39);
    *(long *)puVar20 = auVar61._0_8_;
    puVar20 = puVar20 + stride;
    auVar52._0_2_ = auVar30._0_2_ + 1;
    auVar52._2_2_ = auVar30._2_2_ + 1;
    auVar52._4_2_ = auVar30._4_2_ + 1;
    auVar52._6_2_ = auVar30._6_2_ + 1;
    auVar52._8_2_ = auVar30._8_2_ + 1;
    auVar52._10_2_ = auVar30._10_2_ + 1;
    auVar52._12_2_ = auVar30._12_2_ + 1;
    auVar52._14_2_ = auVar30._14_2_ + 1;
    auVar49._0_2_ = auVar44._0_2_ + 0x202;
    auVar49._2_2_ = auVar44._2_2_ + 0x202;
    auVar49._4_2_ = auVar44._4_2_ + 0x202;
    auVar49._6_2_ = auVar44._6_2_ + 0x202;
    auVar49._8_2_ = auVar44._8_2_ + 0x202;
    auVar49._10_2_ = auVar44._10_2_ + 0x202;
    auVar49._12_2_ = auVar44._12_2_ + 0x202;
    auVar49._14_2_ = auVar44._14_2_ + 0x202;
    iVar18 = iVar18 + -1;
    auVar44 = auVar49;
    auVar30 = auVar52;
  } while (iVar18 != 0);
  iVar18 = 8;
  puVar20 = puVar19 + stride * 8;
  auVar22 = _DAT_005105b0;
  auVar44 = _DAT_004d59a0;
  do {
    auVar30 = pshufb(_DAT_00510720,auVar22);
    auVar61 = pshufb(_DAT_00510730,auVar22);
    auVar34._0_12_ = auVar30._0_12_;
    auVar34._12_2_ = auVar30._6_2_;
    auVar34._14_2_ = auVar61._6_2_;
    auVar33._12_4_ = auVar34._12_4_;
    auVar33._0_10_ = auVar30._0_10_;
    auVar33._10_2_ = auVar61._4_2_;
    auVar32._10_6_ = auVar33._10_6_;
    auVar32._0_8_ = auVar30._0_8_;
    auVar32._8_2_ = auVar30._4_2_;
    auVar31._8_8_ = auVar32._8_8_;
    auVar31._6_2_ = auVar61._2_2_;
    auVar31._4_2_ = auVar30._2_2_;
    auVar31._0_2_ = auVar30._0_2_;
    auVar31._2_2_ = auVar61._0_2_;
    auVar61 = pmaddwd(auVar25,auVar31);
    auVar30 = pshufb(auVar26,auVar44);
    auVar78._0_12_ = auVar30._0_12_;
    auVar78._12_2_ = auVar30._6_2_;
    auVar78._14_2_ = uVar29;
    auVar77._12_4_ = auVar78._12_4_;
    auVar77._0_10_ = auVar30._0_10_;
    auVar77._10_2_ = uVar28;
    auVar76._10_6_ = auVar77._10_6_;
    auVar76._0_8_ = auVar30._0_8_;
    auVar76._8_2_ = auVar30._4_2_;
    auVar75._8_8_ = auVar76._8_8_;
    auVar75._6_2_ = uVar29;
    auVar75._4_2_ = auVar30._2_2_;
    auVar75._0_2_ = auVar30._0_2_;
    auVar75._2_2_ = uVar28;
    auVar30 = pmaddwd(auVar75,auVar16);
    uVar40 = auVar30._0_4_ + 0x100 + auVar61._0_4_;
    uVar46 = auVar30._4_4_ + 0x100 + auVar61._4_4_;
    uVar47 = auVar30._8_4_ + 0x100 + auVar61._8_4_;
    uVar48 = auVar30._12_4_ + 0x100 + auVar61._12_4_;
    auVar30 = pmaddwd(auVar31,auVar23);
    auVar61 = pmaddwd(auVar75,auVar17);
    uVar62 = auVar61._0_4_ + 0x100 + auVar30._0_4_;
    uVar63 = auVar61._4_4_ + 0x100 + auVar30._4_4_;
    uVar64 = auVar61._8_4_ + 0x100 + auVar30._8_4_;
    uVar65 = auVar61._12_4_ + 0x100 + auVar30._12_4_;
    sVar2 = (short)(uVar40 >> 9);
    uVar21 = (ushort)(uVar40 >> 0x19);
    auVar53[1] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar40 >> 0x19) - (0xff < uVar21);
    auVar53[0] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar40 >> 9) - (0xff < sVar2);
    sVar2 = (short)(uVar46 >> 9);
    auVar53[2] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar46 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar46 >> 0x19);
    auVar53[3] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar46 >> 0x19) - (0xff < uVar21);
    sVar2 = (short)(uVar47 >> 9);
    auVar53[4] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar47 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar47 >> 0x19);
    auVar53[5] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar47 >> 0x19) - (0xff < uVar21);
    sVar2 = (short)(uVar48 >> 9);
    auVar53[6] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar48 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar48 >> 0x19);
    auVar53[7] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar48 >> 0x19) - (0xff < uVar21);
    sVar2 = (short)(uVar62 >> 9);
    auVar53[8] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar62 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar62 >> 0x19);
    auVar53[9] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar62 >> 0x19) - (0xff < uVar21);
    sVar2 = (short)(uVar63 >> 9);
    auVar53[10] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar63 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar63 >> 0x19);
    auVar53[0xb] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar63 >> 0x19) - (0xff < uVar21);
    sVar2 = (short)(uVar64 >> 9);
    auVar53[0xc] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar64 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar64 >> 0x19);
    auVar53[0xd] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar64 >> 0x19) - (0xff < uVar21);
    sVar2 = (short)(uVar65 >> 9);
    auVar53[0xe] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar65 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar65 >> 0x19);
    auVar53[0xf] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar65 >> 0x19) - (0xff < uVar21);
    auVar30 = pshufb(auVar53,auVar39);
    *(long *)puVar20 = auVar30._0_8_;
    puVar20 = puVar20 + stride;
    auVar50._0_2_ = auVar44._0_2_ + 1;
    auVar50._2_2_ = auVar44._2_2_ + 1;
    auVar50._4_2_ = auVar44._4_2_ + 1;
    auVar50._6_2_ = auVar44._6_2_ + 1;
    auVar50._8_2_ = auVar44._8_2_ + 1;
    auVar50._10_2_ = auVar44._10_2_ + 1;
    auVar50._12_2_ = auVar44._12_2_ + 1;
    auVar50._14_2_ = auVar44._14_2_ + 1;
    auVar44._0_2_ = auVar22._0_2_ + 0x202;
    auVar44._2_2_ = auVar22._2_2_ + 0x202;
    auVar44._4_2_ = auVar22._4_2_ + 0x202;
    auVar44._6_2_ = auVar22._6_2_ + 0x202;
    auVar44._8_2_ = auVar22._8_2_ + 0x202;
    auVar44._10_2_ = auVar22._10_2_ + 0x202;
    auVar44._12_2_ = auVar22._12_2_ + 0x202;
    auVar44._14_2_ = auVar22._14_2_ + 0x202;
    iVar18 = iVar18 + -1;
    auVar22 = auVar44;
    auVar44 = auVar50;
  } while (iVar18 != 0);
  puVar19 = puVar19 + stride * 8 + stride * 8;
  iVar18 = 8;
  auVar22 = _DAT_005105b0;
  auVar44 = _DAT_00510660;
  do {
    auVar30 = pshufb(_DAT_00510740,auVar22);
    auVar61 = pshufb(_DAT_00510750,auVar22);
    auVar38._0_12_ = auVar30._0_12_;
    auVar38._12_2_ = auVar30._6_2_;
    auVar38._14_2_ = auVar61._6_2_;
    auVar37._12_4_ = auVar38._12_4_;
    auVar37._0_10_ = auVar30._0_10_;
    auVar37._10_2_ = auVar61._4_2_;
    auVar36._10_6_ = auVar37._10_6_;
    auVar36._0_8_ = auVar30._0_8_;
    auVar36._8_2_ = auVar30._4_2_;
    auVar35._8_8_ = auVar36._8_8_;
    auVar35._6_2_ = auVar61._2_2_;
    auVar35._4_2_ = auVar30._2_2_;
    auVar35._0_2_ = auVar30._0_2_;
    auVar35._2_2_ = auVar61._0_2_;
    auVar61 = pmaddwd(auVar25,auVar35);
    auVar30 = pshufb(auVar26,auVar44);
    auVar82._0_12_ = auVar30._0_12_;
    auVar82._12_2_ = auVar30._6_2_;
    auVar82._14_2_ = uVar29;
    auVar81._12_4_ = auVar82._12_4_;
    auVar81._0_10_ = auVar30._0_10_;
    auVar81._10_2_ = uVar28;
    auVar80._10_6_ = auVar81._10_6_;
    auVar80._0_8_ = auVar30._0_8_;
    auVar80._8_2_ = auVar30._4_2_;
    auVar79._8_8_ = auVar80._8_8_;
    auVar79._6_2_ = uVar29;
    auVar79._4_2_ = auVar30._2_2_;
    auVar79._0_2_ = auVar30._0_2_;
    auVar79._2_2_ = uVar28;
    auVar30 = pmaddwd(auVar79,auVar16);
    uVar40 = auVar30._0_4_ + 0x100 + auVar61._0_4_;
    uVar46 = auVar30._4_4_ + 0x100 + auVar61._4_4_;
    uVar47 = auVar30._8_4_ + 0x100 + auVar61._8_4_;
    uVar48 = auVar30._12_4_ + 0x100 + auVar61._12_4_;
    auVar30 = pmaddwd(auVar35,auVar23);
    auVar61 = pmaddwd(auVar79,auVar17);
    uVar62 = auVar61._0_4_ + 0x100 + auVar30._0_4_;
    uVar63 = auVar61._4_4_ + 0x100 + auVar30._4_4_;
    uVar64 = auVar61._8_4_ + 0x100 + auVar30._8_4_;
    uVar65 = auVar61._12_4_ + 0x100 + auVar30._12_4_;
    sVar2 = (short)(uVar40 >> 9);
    uVar21 = (ushort)(uVar40 >> 0x19);
    auVar54[1] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar40 >> 0x19) - (0xff < uVar21);
    auVar54[0] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar40 >> 9) - (0xff < sVar2);
    sVar2 = (short)(uVar46 >> 9);
    auVar54[2] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar46 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar46 >> 0x19);
    auVar54[3] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar46 >> 0x19) - (0xff < uVar21);
    sVar2 = (short)(uVar47 >> 9);
    auVar54[4] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar47 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar47 >> 0x19);
    auVar54[5] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar47 >> 0x19) - (0xff < uVar21);
    sVar2 = (short)(uVar48 >> 9);
    auVar54[6] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar48 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar48 >> 0x19);
    auVar54[7] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar48 >> 0x19) - (0xff < uVar21);
    sVar2 = (short)(uVar62 >> 9);
    auVar54[8] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar62 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar62 >> 0x19);
    auVar54[9] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar62 >> 0x19) - (0xff < uVar21);
    sVar2 = (short)(uVar63 >> 9);
    auVar54[10] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar63 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar63 >> 0x19);
    auVar54[0xb] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar63 >> 0x19) - (0xff < uVar21);
    sVar2 = (short)(uVar64 >> 9);
    auVar54[0xc] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar64 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar64 >> 0x19);
    auVar54[0xd] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar64 >> 0x19) - (0xff < uVar21);
    sVar2 = (short)(uVar65 >> 9);
    auVar54[0xe] = (0 < sVar2) * (sVar2 < 0x100) * (char)(uVar65 >> 9) - (0xff < sVar2);
    uVar21 = (ushort)(uVar65 >> 0x19);
    auVar54[0xf] = (uVar21 != 0) * (uVar21 < 0x100) * (byte)(uVar65 >> 0x19) - (0xff < uVar21);
    auVar30 = pshufb(auVar54,auVar39);
    *(long *)puVar19 = auVar30._0_8_;
    puVar19 = puVar19 + stride;
    auVar51._0_2_ = auVar44._0_2_ + 1;
    auVar51._2_2_ = auVar44._2_2_ + 1;
    auVar51._4_2_ = auVar44._4_2_ + 1;
    auVar51._6_2_ = auVar44._6_2_ + 1;
    auVar51._8_2_ = auVar44._8_2_ + 1;
    auVar51._10_2_ = auVar44._10_2_ + 1;
    auVar51._12_2_ = auVar44._12_2_ + 1;
    auVar51._14_2_ = auVar44._14_2_ + 1;
    auVar45._0_2_ = auVar22._0_2_ + 0x202;
    auVar45._2_2_ = auVar22._2_2_ + 0x202;
    auVar45._4_2_ = auVar22._4_2_ + 0x202;
    auVar45._6_2_ = auVar22._6_2_ + 0x202;
    auVar45._8_2_ = auVar22._8_2_ + 0x202;
    auVar45._10_2_ = auVar22._10_2_ + 0x202;
    auVar45._12_2_ = auVar22._12_2_ + 0x202;
    auVar45._14_2_ = auVar22._14_2_ + 0x202;
    iVar18 = iVar18 + -1;
    auVar22 = auVar45;
    auVar44 = auVar51;
  } while (iVar18 != 0);
  return;
}

Assistant:

static inline void load_pixel_w8(const uint8_t *above, const uint8_t *left,
                                 int height, __m128i *pixels) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i bp = _mm_set1_epi16((int16_t)left[height - 1]);
  __m128i d = _mm_loadl_epi64((const __m128i *)above);
  d = _mm_unpacklo_epi8(d, zero);
  pixels[0] = _mm_unpacklo_epi16(d, bp);
  pixels[1] = _mm_unpackhi_epi16(d, bp);

  pixels[3] = _mm_set1_epi16((int16_t)above[7]);

  if (height == 4) {
    pixels[2] = _mm_cvtsi32_si128(((const int *)left)[0]);
  } else if (height == 8) {
    pixels[2] = _mm_loadl_epi64((const __m128i *)left);
  } else if (height == 16) {
    pixels[2] = _mm_load_si128((const __m128i *)left);
  } else {
    pixels[2] = _mm_load_si128((const __m128i *)left);
    pixels[4] = pixels[0];
    pixels[5] = pixels[1];
    pixels[6] = _mm_load_si128((const __m128i *)(left + 16));
    pixels[7] = pixels[3];
  }
}